

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

int __thiscall cmGraphVizWriter::CollectAllTargets(cmGraphVizWriter *this)

{
  char *pcVar1;
  mapped_type pcVar2;
  bool bVar3;
  string *psVar4;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar5;
  pointer ppcVar6;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  ostringstream ostr;
  int local_220;
  allocator local_219;
  key_type local_218;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_1f8;
  pointer local_1e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  *local_1d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d0;
  key_type local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1e0 = (this->LocalGenerators->
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if (local_1e0 ==
      (this->LocalGenerators->
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_220 = 0;
  }
  else {
    local_1d0 = &this->TargetNamesNodes;
    local_1d8 = &this->TargetPtrs;
    local_220 = 0;
    do {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_1f8,&(*local_1e0)->GeneratorTargets);
      for (ppcVar6 = local_1f8.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppcVar6 !=
          local_1f8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
        pcVar1 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::string((string *)local_1a8,pcVar1,(allocator *)&local_218);
        bVar3 = IgnoreThisTarget(this,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          this_00 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(this->GraphNodePrefix)._M_dataplus._M_p,
                               (this->GraphNodePrefix)._M_string_length);
          std::ostream::operator<<(this_00,local_220);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string((string *)&local_1c8,pcVar1,&local_219);
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](local_1d0,&local_1c8);
          std::__cxx11::string::operator=((string *)this_01,(string *)&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          pcVar2 = *ppcVar6;
          std::__cxx11::string::string((string *)&local_218,pcVar1,(allocator *)&local_1c8);
          ppcVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                    ::operator[](local_1d8,&local_218);
          *ppcVar5 = pcVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          local_220 = local_220 + 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      if (local_1f8.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 !=
             (this->LocalGenerators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return local_220;
}

Assistant:

int cmGraphVizWriter::CollectAllTargets()
{
  int cnt = 0;
  // First pass get the list of all cmake targets
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
         this->LocalGenerators.begin();
       lit != this->LocalGenerators.end(); ++lit) {
    std::vector<cmGeneratorTarget*> targets = (*lit)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator it = targets.begin();
         it != targets.end(); ++it) {
      const char* realTargetName = (*it)->GetName().c_str();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      // std::cout << "Found target: " << tit->first << std::endl;
      std::ostringstream ostr;
      ostr << this->GraphNodePrefix << cnt++;
      this->TargetNamesNodes[realTargetName] = ostr.str();
      this->TargetPtrs[realTargetName] = *it;
    }
  }

  return cnt;
}